

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1ba5289::DescriptorImpl::DescriptorImpl
          (DescriptorImpl *this,
          vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          *pubkeys,unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                   *script,string *name)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Descriptor::Descriptor((Descriptor *)in_stack_ffffffffffffff98);
  *in_RDI = &PTR__DescriptorImpl_016192d0;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::vector(in_stack_ffffffffffffff98,
           (vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            *)0xe8e801);
  std::__cxx11::string::string(in_RDX,in_RCX);
  Vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>>
            ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
              *)in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

DescriptorImpl(std::vector<std::unique_ptr<PubkeyProvider>> pubkeys, std::unique_ptr<DescriptorImpl> script, const std::string& name) : m_pubkey_args(std::move(pubkeys)), m_name(name), m_subdescriptor_args(Vector(std::move(script))) {}